

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O1

ChQuaternion<double> *
chrono::Qdt_from_Wabs
          (ChQuaternion<double> *__return_storage_ptr__,ChVector<double> *w,ChQuaternion<double> *q)

{
  ChQuaternion<double> local_58;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = w->m_data[0];
  local_58.m_data[2] = w->m_data[1];
  local_58.m_data[3] = w->m_data[2];
  Qcross(&local_58,q);
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  __return_storage_ptr__->m_data[0] = local_30 * 0.5;
  __return_storage_ptr__->m_data[1] = local_28 * 0.5;
  __return_storage_ptr__->m_data[2] = local_20 * 0.5;
  __return_storage_ptr__->m_data[3] = local_18 * 0.5;
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> Qdt_from_Wabs(const ChVector<double>& w, const ChQuaternion<double>& q) {
    ChQuaternion<double> qw;
    double half = 0.5;

    qw.e0() = 0;
    qw.e1() = w.x();
    qw.e2() = w.y();
    qw.e3() = w.z();

    return Qscale(Qcross(qw, q), half);  // {q_dt} = 1/2 {0,w}*{q}
}